

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O3

void check_readonly(LexState *ls,expdesc *e)

{
  expkind eVar1;
  FuncState *pFVar2;
  Vardesc *pVVar3;
  Upvaldesc *pUVar4;
  char *msg;
  long lVar5;
  
  pFVar2 = ls->fs;
  eVar1 = e->k;
  if (eVar1 == VLOCAL) {
    pVVar3 = (pFVar2->ls->dyd->actvar).arr;
    lVar5 = (long)pFVar2->firstlocal + (ulong)(e->u).var.vidx;
    if (*(char *)((long)pVVar3 + lVar5 * 0x18 + 9) == '\0') {
      return;
    }
    pUVar4 = (Upvaldesc *)&(&pVVar3->vd)[lVar5].name;
  }
  else if (eVar1 == VUPVAL) {
    pUVar4 = pFVar2->f->upvalues;
    if (pUVar4[(e->u).info].kind == '\0') {
      return;
    }
    pUVar4 = pUVar4 + (e->u).info;
  }
  else {
    if (eVar1 != VCONST) {
      return;
    }
    pUVar4 = (Upvaldesc *)&(&((ls->dyd->actvar).arr)->vd)[(e->u).info].name;
  }
  if (pUVar4->name == (TString *)0x0) {
    return;
  }
  msg = luaO_pushfstring(ls->L,"attempt to assign to const variable \'%s\'",pUVar4->name->contents);
  luaK_semerror(ls,msg);
}

Assistant:

static void check_readonly (LexState *ls, expdesc *e) {
  FuncState *fs = ls->fs;
  TString *varname = NULL;  /* to be set if variable is const */
  switch (e->k) {
    case VCONST: {
      varname = ls->dyd->actvar.arr[e->u.info].vd.name;
      break;
    }
    case VLOCAL: {
      Vardesc *vardesc = getlocalvardesc(fs, e->u.var.vidx);
      if (vardesc->vd.kind != VDKREG)  /* not a regular variable? */
        varname = vardesc->vd.name;
      break;
    }
    case VUPVAL: {
      Upvaldesc *up = &fs->f->upvalues[e->u.info];
      if (up->kind != VDKREG)
        varname = up->name;
      break;
    }
    default:
      return;  /* other cases cannot be read-only */
  }
  if (varname) {
    const char *msg = luaO_pushfstring(ls->L,
       "attempt to assign to const variable '%s'", getstr(varname));
    luaK_semerror(ls, msg);  /* error */
  }
}